

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::to_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id,bool allow_alias)

{
  SPIRFunction *pSVar1;
  size_type sVar2;
  pointer pcVar3;
  Meta *pMVar4;
  
  pSVar1 = (this->super_CompilerGLSL).super_Compiler.current_function;
  if ((((pSVar1 != (SPIRFunction *)0x0) &&
       ((pSVar1->super_IVariant).self.id ==
        (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id)) &&
      (pMVar4 = ParsedIR::find_meta(&(this->super_CompilerGLSL).super_Compiler.ir,(ID)id),
      pMVar4 != (Meta *)0x0)) &&
     (((pMVar4->decoration).qualified_alias_explicit_override == false &&
      (sVar2 = (pMVar4->decoration).qualified_alias._M_string_length, sVar2 != 0)))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (pMVar4->decoration).qualified_alias._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar2);
    return __return_storage_ptr__;
  }
  Compiler::to_name_abi_cxx11_(__return_storage_ptr__,(Compiler *)this,id,allow_alias);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_name(uint32_t id, bool allow_alias) const
{
	if (current_function && (current_function->self == ir.default_entry_point))
	{
		auto *m = ir.find_meta(id);
		if (m && !m->decoration.qualified_alias_explicit_override && !m->decoration.qualified_alias.empty())
			return m->decoration.qualified_alias;
	}
	return Compiler::to_name(id, allow_alias);
}